

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionHelper.cpp
# Opt level: O0

EStatusCode __thiscall
EncryptionHelper::Setup(EncryptionHelper *this,DecryptionHelper *inDecryptionSource)

{
  bool bVar1;
  uint uVar2;
  longlong lVar3;
  ByteList *pBVar4;
  StringToXCryptionCommonMap *pSVar5;
  XCryptionCommon *pXVar6;
  pointer ppVar7;
  XCryptionCommon *pXVar8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
  local_70;
  XCryptionCommon *local_38;
  XCryptionCommon *xCryption;
  const_iterator itEnd;
  const_iterator it;
  DecryptionHelper *inDecryptionSource_local;
  EncryptionHelper *this_local;
  
  bVar1 = DecryptionHelper::IsEncrypted(inDecryptionSource);
  if ((bVar1) && (bVar1 = DecryptionHelper::CanDecryptDocument(inDecryptionSource), bVar1)) {
    this->mIsDocumentEncrypted = false;
    this->mSupportsEncryption = false;
    uVar2 = DecryptionHelper::GetLength(inDecryptionSource);
    this->mLength = uVar2;
    uVar2 = DecryptionHelper::GetV(inDecryptionSource);
    this->mV = uVar2;
    uVar2 = DecryptionHelper::GetRevision(inDecryptionSource);
    this->mRevision = uVar2;
    lVar3 = DecryptionHelper::GetP(inDecryptionSource);
    this->mP = lVar3;
    bVar1 = DecryptionHelper::GetEncryptMetaData(inDecryptionSource);
    this->mEncryptMetaData = bVar1;
    pBVar4 = DecryptionHelper::GetFileIDPart1_abi_cxx11_(inDecryptionSource);
    std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->mFileIDPart1,pBVar4);
    pBVar4 = DecryptionHelper::GetO_abi_cxx11_(inDecryptionSource);
    std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mO,pBVar4);
    pBVar4 = DecryptionHelper::GetU_abi_cxx11_(inDecryptionSource);
    std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mU,pBVar4);
    this->mXcryptStreams = (XCryptionCommon *)0x0;
    this->mXcryptStrings = (XCryptionCommon *)0x0;
    this->mXcryptAuthentication = (XCryptionCommon *)0x0;
    pSVar5 = DecryptionHelper::GetXcrypts_abi_cxx11_(inDecryptionSource);
    itEnd = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
            ::begin(pSVar5);
    pSVar5 = DecryptionHelper::GetXcrypts_abi_cxx11_(inDecryptionSource);
    xCryption = (XCryptionCommon *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
                ::end(pSVar5);
    while (bVar1 = std::operator!=(&itEnd,(_Self *)&xCryption), bVar1) {
      pXVar6 = (XCryptionCommon *)operator_new(0x58);
      XCryptionCommon::XCryptionCommon(pXVar6);
      local_38 = pXVar6;
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>
               ::operator->(&itEnd);
      bVar1 = XCryptionCommon::IsUsingAES(ppVar7->second);
      XCryptionCommon::Setup(pXVar6,bVar1);
      pXVar6 = local_38;
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>
               ::operator->(&itEnd);
      pBVar4 = XCryptionCommon::GetInitialEncryptionKey_abi_cxx11_(ppVar7->second);
      XCryptionCommon::SetupInitialEncryptionKey(pXVar6,pBVar4);
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>
               ::operator->(&itEnd);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
      ::pair<XCryptionCommon_*&,_true>(&local_70,&ppVar7->first,&local_38);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
      ::insert(&this->mXcrypts,&local_70);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>
      ::~pair(&local_70);
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>
               ::operator->(&itEnd);
      pXVar6 = ppVar7->second;
      pXVar8 = DecryptionHelper::GetStreamXcrypt(inDecryptionSource);
      if (pXVar6 == pXVar8) {
        this->mXcryptStreams = local_38;
      }
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>
               ::operator->(&itEnd);
      pXVar6 = ppVar7->second;
      pXVar8 = DecryptionHelper::GetStringXcrypt(inDecryptionSource);
      if (pXVar6 == pXVar8) {
        this->mXcryptStrings = local_38;
      }
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>
               ::operator->(&itEnd);
      pXVar6 = ppVar7->second;
      pXVar8 = DecryptionHelper::GetAuthenticationXcrypt(inDecryptionSource);
      if (pXVar6 == pXVar8) {
        this->mXcryptAuthentication = local_38;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>
      ::operator++(&itEnd);
    }
    this->mIsDocumentEncrypted = true;
    this->mSupportsEncryption = true;
  }
  else {
    SetupNoEncryption(this);
  }
  return eSuccess;
}

Assistant:

EStatusCode EncryptionHelper::Setup(const DecryptionHelper& inDecryptionSource) 
{
	if (!inDecryptionSource.IsEncrypted() || !inDecryptionSource.CanDecryptDocument()) {
		SetupNoEncryption();
		return eSuccess;
	}

	mIsDocumentEncrypted = false;
	mSupportsEncryption = false;

	do {

		mLength = inDecryptionSource.GetLength();
		mV = inDecryptionSource.GetV();
		mRevision = inDecryptionSource.GetRevision();
		mP = inDecryptionSource.GetP();
		mEncryptMetaData = inDecryptionSource.GetEncryptMetaData();
		mFileIDPart1 = inDecryptionSource.GetFileIDPart1();
		mO = inDecryptionSource.GetO();
		mU = inDecryptionSource.GetU();

		// initialize xcryptors
		mXcryptStreams = NULL;
		// xcrypt to use for strings
		mXcryptStrings = NULL;
		// xcrypt to use for password authentication
		mXcryptAuthentication = NULL;
		StringToXCryptionCommonMap::const_iterator it = inDecryptionSource.GetXcrypts().begin();
		StringToXCryptionCommonMap::const_iterator itEnd = inDecryptionSource.GetXcrypts().end();
		for (; it != itEnd; ++it) {
			XCryptionCommon* xCryption = new XCryptionCommon();
			xCryption->Setup(it->second->IsUsingAES());
			xCryption->SetupInitialEncryptionKey(it->second->GetInitialEncryptionKey());
			mXcrypts.insert(StringToXCryptionCommonMap::value_type(it->first, xCryption));

			// see if it fits any of the global xcryptors
			if (it->second == inDecryptionSource.GetStreamXcrypt())
				mXcryptStreams = xCryption;
			if (it->second == inDecryptionSource.GetStringXcrypt())
				mXcryptStrings = xCryption;
			if (it->second == inDecryptionSource.GetAuthenticationXcrypt())
				mXcryptAuthentication = xCryption;
		}


		mIsDocumentEncrypted = true;
		mSupportsEncryption = true;
	} while (false);

	return eSuccess;
}